

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BFS.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  LIndex LVar4;
  undefined8 in_RSI;
  undefined4 in_EDI;
  E *e;
  string outputFileName;
  char s [10];
  double V;
  clock_t utime;
  clock_t ticks;
  clock_t ticks_after;
  clock_t ticks_before;
  tms ts_after;
  tms ts_before;
  int restartI;
  BruteForceSearchPlanner bfs;
  PlanningUnitMADPDiscreteParameters params;
  ofstream of;
  string filename;
  stringstream ss;
  DecPOMDPDiscreteInterface *decpomdp;
  int restarts;
  Arguments args;
  string *in_stack_fffffffffffff488;
  JointPolicyPureVector *in_stack_fffffffffffff490;
  type in_stack_fffffffffffff4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4b8;
  allocator<char> *in_stack_fffffffffffff4c0;
  char *in_stack_fffffffffffff4c8;
  char *__s;
  Arguments *in_stack_fffffffffffff4d0;
  shared_ptr<JointPolicyPureVector> local_a98;
  string local_a88 [32];
  shared_ptr<JointPolicyPureVector> local_a68;
  char local_a52 [10];
  double local_a48;
  long local_a40;
  long local_a38;
  clock_t local_a30;
  clock_t local_a28;
  tms local_a20;
  tms local_a00;
  int local_9dc;
  BruteForceSearchPlanner local_9d8 [855];
  PlanningUnitMADPDiscreteParameters local_681 [9];
  string local_678 [36];
  int local_654;
  long local_650 [64];
  string local_450 [39];
  allocator<char> local_429;
  MultiAgentDecisionProcessInterface local_428 [32];
  string local_408 [32];
  stringstream local_3e8 [16];
  ostream local_3d8 [376];
  DecPOMDPDiscreteInterface *local_260;
  int local_258;
  Arguments local_248;
  undefined8 local_10;
  undefined4 local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  ArgumentHandlers::Arguments::Arguments(in_stack_fffffffffffff4d0);
  argp_parse(ArgumentHandlers::theArgpStruc,local_8,local_10,0,0,&local_248);
  local_258 = local_248.nrRestarts;
  local_260 = (DecPOMDPDiscreteInterface *)
              ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&local_248);
  std::__cxx11::stringstream::stringstream(local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
  directories::MADPGetResultsFilename
            (local_408,local_428,(Arguments *)(local_260 + *(long *)(*(long *)local_260 + -0x40)));
  poVar2 = std::operator<<(local_3d8,local_408);
  poVar2 = std::operator<<(poVar2,"h");
  std::ostream::operator<<(poVar2,local_248.horizon);
  std::__cxx11::string::~string(local_408);
  std::__cxx11::string::~string((string *)local_428);
  std::allocator<char>::~allocator(&local_429);
  std::__cxx11::stringstream::str();
  uVar3 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_650,uVar3,0x10);
  bVar1 = std::ios::operator!((ios *)((long)local_650 + *(long *)(local_650[0] + -0x18)));
  if (((bVar1 & 1) == 0) || (local_248.dryrun != 0)) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Computing ");
    std::__cxx11::stringstream::str();
    poVar2 = std::operator<<(poVar2,local_678);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_678);
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_681);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_681,0));
    if (local_248.sparse == 0) {
      PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_681,false);
    }
    else {
      PlanningUnitMADPDiscreteParameters::SetUseSparseJointBeliefs(local_681,true);
    }
    BruteForceSearchPlanner::BruteForceSearchPlanner
              (local_9d8,(long)local_248.horizon,local_260,local_681);
    poVar2 = std::operator<<((ostream *)&std::cout,"BruteForceSearchPlanner initialized");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    for (local_9dc = 0; local_9dc < local_258; local_9dc = local_9dc + 1) {
      local_a28 = times(&local_a00);
      BruteForceSearchPlanner::Plan();
      local_a30 = times(&local_a20);
      local_a38 = local_a30 - local_a28;
      local_a40 = local_a20.tms_utime - local_a00.tms_utime;
      local_a48 = BruteForceSearchPlanner::GetExpectedReward(local_9d8);
      poVar2 = std::operator<<((ostream *)&std::cout,"\nvalue=");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_a48);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      if (local_248.dryrun == 0) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_650,local_248.horizon);
        std::operator<<(poVar2,"\t");
        __s = local_a52;
        sprintf(__s,"%.6f",local_a48);
        poVar2 = std::operator<<((ostream *)local_650,__s);
        std::operator<<(poVar2,"\t");
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_650,local_a38);
        std::operator<<(poVar2,"\t");
        in_stack_fffffffffffff4b8 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::ostream::operator<<((ostream *)local_650,local_a40);
        std::operator<<((ostream *)in_stack_fffffffffffff4b8,"\t");
        BruteForceSearchPlanner::GetJointPolicyPureVector
                  ((BruteForceSearchPlanner *)in_stack_fffffffffffff488);
        in_stack_fffffffffffff4b0 = boost::shared_ptr<JointPolicyPureVector>::operator->(&local_a68)
        ;
        LVar4 = JointPolicyPureVector::GetIndex((JointPolicyPureVector *)0x104784);
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_650,LVar4);
        std::operator<<(poVar2,"\n");
        boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                  ((shared_ptr<JointPolicyPureVector> *)0x1047c4);
        std::ostream::flush();
      }
    }
    if ((local_248.dryrun == 0) && ((local_248.outputPolicy & 1U) != 0)) {
      std::operator+(in_stack_fffffffffffff4b8,(char *)in_stack_fffffffffffff4b0);
      BruteForceSearchPlanner::GetJointPolicyPureVector
                ((BruteForceSearchPlanner *)in_stack_fffffffffffff488);
      boost::shared_ptr<JointPolicyPureVector>::operator->(&local_a98);
      in_stack_fffffffffffff490 =
           (JointPolicyPureVector *)PlanningUnit::GetHorizon((PlanningUnit *)local_9d8);
      JointPolicyPureVector::ExportPolicyToFile
                (in_stack_fffffffffffff490,in_stack_fffffffffffff488,(Index *)0x1048cb);
      boost::shared_ptr<JointPolicyPureVector>::~shared_ptr
                ((shared_ptr<JointPolicyPureVector> *)0x1048da);
      std::__cxx11::string::~string(local_a88);
    }
    BruteForceSearchPlanner::~BruteForceSearchPlanner
              ((BruteForceSearchPlanner *)in_stack_fffffffffffff490);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_681);
    local_654 = 0;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,"BFS: could not open ");
    poVar2 = std::operator<<(poVar2,local_450);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
    local_654 = 1;
  }
  std::ofstream::~ofstream(local_650);
  std::__cxx11::string::~string(local_450);
  std::__cxx11::stringstream::~stringstream(local_3e8);
  if (local_654 == 0) {
    local_654 = 0;
  }
  ArgumentHandlers::Arguments::~Arguments((Arguments *)0x104a24);
  return local_4;
}

Assistant:

int main(int argc, char **argv)
{
    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);
    int restarts = args.nrRestarts;

    try {

    DecPOMDPDiscreteInterface* decpomdp =
        GetDecPOMDPDiscreteInterfaceFromArgs(args);

    stringstream ss;
    ss << directories::MADPGetResultsFilename("BFS",*decpomdp,args)
       << "h" << args.horizon;
    string filename=ss.str();
    ofstream of(filename.c_str());
    if(!of && !args.dryrun)
    {
        cerr << "BFS: could not open " << filename << endl;
        return(1);
    }

    cout << "Computing " << ss.str() << endl;
    
    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(true);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);

    BruteForceSearchPlanner bfs(args.horizon, decpomdp, &params);

    cout << "BruteForceSearchPlanner initialized" << endl;


    for(int restartI = 0; restartI < restarts; restartI++)
    {
        tms ts_before, ts_after;
        clock_t ticks_before, ticks_after;
        ticks_before = times(&ts_before);

        bfs.Plan();

        ticks_after = times(&ts_after);
        clock_t ticks =  ticks_after - ticks_before;
        clock_t utime =   ts_after.tms_utime - ts_before.tms_utime;


        double V = bfs.GetExpectedReward();
        cout << "\nvalue="<< V << endl;
//        bfs.GetJointPolicyPureVector()->Print();

        if(! args.dryrun)
        {
            of << args.horizon<<"\t";
            char s[10];
            sprintf(s, "%.6f", V);
            of << s <<"\t";
            of << ticks <<"\t";
            of << utime <<"\t";
            of << bfs.GetJointPolicyPureVector()->GetIndex() <<"\n";
            of.flush();
        }
    }

    if(!args.dryrun && args.outputPolicy)
    {
        string outputFileName = filename + "_PolicyFile";
        bfs.GetJointPolicyPureVector()->ExportPolicyToFile(outputFileName, bfs.GetHorizon());
    }

    } catch(E& e){ e.Print(); }
}